

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

bool dxil_spv::emit_atomic_binop_instruction(Impl *impl,CallInst *instruction)

{
  StorageClass storage;
  uint uVar1;
  Op op;
  Builder *pBVar2;
  ValueKind VVar3;
  Id IVar4;
  RawWidth width;
  Id type_id;
  Value *pVVar5;
  mapped_type *meta;
  Constant *this;
  APInt *this_00;
  uint64_t uVar6;
  Type *pTVar7;
  BufferAccessInfo BVar8;
  Operation *this_01;
  LoggingCallback p_Var9;
  void *pvVar10;
  ComponentType component_type_00;
  ulong uVar11;
  bool bVar12;
  uint32_t num_coords_full;
  Id image_id;
  ComponentType component_type;
  uint32_t num_coords;
  Id coords [3];
  uint32_t local_105c;
  Id local_1058;
  Capability local_1054;
  undefined8 local_1050;
  uint32_t local_1044;
  Builder *local_1040;
  Id local_1038 [5];
  char acStack_1023 [4083];
  
  local_1040 = Converter::Impl::builder(impl);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_1058 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
  meta = std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&impl->handle_to_resource_meta,&local_1058);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  this = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar5);
  VVar3 = LLVMBC::Value::get_value_kind((Value *)this);
  if (VVar3 != ConstantInt) {
    p_Var9 = get_thread_log_callback();
    if (p_Var9 == (LoggingCallback)0x0) {
      emit_atomic_binop_instruction();
      std::terminate();
    }
    stack0xffffffffffffefd8 = 0x6163206e69;
    builtin_strncpy(acStack_1023,"st<T>.\n",8);
    local_1038._0_8_ = 0x2064696c61766e49;
    local_1038[2] = 0x65707974;
    local_1038[3] = 0x20444920;
    pvVar10 = get_thread_log_callback_userdata();
    (*p_Var9)(pvVar10,Error,(char *)local_1038);
    std::terminate();
  }
  this_00 = LLVMBC::Constant::getUniqueInteger(this);
  uVar6 = LLVMBC::APInt::getZExtValue(this_00);
  emit_buffer_synchronization_validation(impl,instruction,AtomicRMW);
  local_1038[2] = 0;
  local_1038[0] = 0;
  local_1038[1] = 0;
  local_105c = 0;
  local_1044 = 0;
  local_1050 = uVar6;
  if ((byte)(meta->kind - TypedBuffer) < 3) {
    IVar4 = meta->index_offset_id;
    pTVar7 = LLVMBC::Value::getType((Value *)instruction);
    BVar8 = build_buffer_access(impl,instruction,1,IVar4,pTVar7,1);
    local_1038[0] = BVar8.index_id;
    local_1044 = 1;
    local_105c = 1;
  }
  else {
    bVar12 = get_image_dimensions(impl,local_1058,&local_105c,&local_1044);
    if (3 < local_105c || !bVar12) {
      return false;
    }
    if (local_105c != 0) {
      uVar11 = 0;
      do {
        pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar11 + 3);
        IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
        local_1038[uVar11] = IVar4;
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_105c);
    }
  }
  pBVar2 = local_1040;
  IVar4 = spv::Builder::makeIntegerType(local_1040,0x20,false);
  IVar4 = Converter::Impl::build_vector(impl,IVar4,local_1038,local_105c);
  storage = meta->storage;
  pTVar7 = LLVMBC::Value::getType((Value *)instruction);
  uVar1._0_1_ = (impl->execution_mode_meta).native_16bit_operations;
  uVar1._1_1_ = (impl->execution_mode_meta).synthesize_2d_quad_dispatch;
  uVar1._2_1_ = (impl->execution_mode_meta).synthesize_dummy_derivatives;
  uVar1._3_1_ = (impl->execution_mode_meta).field_0x33;
  width = get_buffer_access_bits_per_component((Impl *)(ulong)uVar1,storage,pTVar7);
  if (width == B64) {
    local_1054 = CapabilityInt64Atomics;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar2->capabilities,&local_1054);
    width = B64;
  }
  IVar4 = emit_atomic_access_chain(impl,meta,width,local_1058,IVar4,(ComponentType *)&local_1054);
  uVar6 = local_1050;
  if (meta->non_uniform == true) {
    spv::Builder::addDecoration(local_1040,IVar4,DecorationNonUniform,-1);
  }
  bVar12 = (byte)uVar6 < 9;
  if (bVar12) {
    op = *(Op *)(&DAT_001c28c0 + (ulong)((uint)uVar6 & 0xf) * 4);
    local_1050 = CONCAT44(local_1050._4_4_,local_1054) & 0xffffffff000000ff;
    type_id = Converter::Impl::get_type_id(impl,(undefined1)local_1054,1,1,false);
    this_01 = Converter::Impl::allocate(impl,op,(Value *)instruction,type_id);
    Operation::add_id(this_01,IVar4);
    pBVar2 = local_1040;
    IVar4 = spv::Builder::makeIntegerType(local_1040,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(pBVar2,IVar4,1,false);
    Operation::add_id(this_01,IVar4);
    IVar4 = spv::Builder::makeIntegerType(pBVar2,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(pBVar2,IVar4,0,false);
    Operation::add_id(this_01,IVar4);
    pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,6);
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
    component_type_00 = (ComponentType)local_1050;
    IVar4 = Converter::Impl::fixup_store_type_atomic(impl,component_type_00,1,IVar4);
    Operation::add_id(this_01,IVar4);
    Converter::Impl::add(impl,this_01,meta->rov);
    Converter::Impl::fixup_load_type_atomic(impl,component_type_00,1,(Value *)instruction);
  }
  return bVar12;
}

Assistant:

bool emit_atomic_binop_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];
	auto binop = static_cast<DXIL::AtomicBinOp>(
	    llvm::cast<llvm::ConstantInt>(instruction->getOperand(2))->getUniqueInteger().getZExtValue());

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::AtomicRMW);

	spv::Id coords[3] = {};
	uint32_t num_coords_full = 0, num_coords = 0;

	if (meta.kind == DXIL::ResourceKind::StructuredBuffer || meta.kind == DXIL::ResourceKind::RawBuffer ||
	    meta.kind == DXIL::ResourceKind::TypedBuffer)
	{
		auto access = build_buffer_access(impl, instruction, 1, meta.index_offset_id, instruction->getType(), 1);
		coords[0] = access.index_id;
		num_coords = 1;
		num_coords_full = 1;
	}
	else
	{
		if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
			return false;

		if (num_coords_full > 3)
			return false;

		for (uint32_t i = 0; i < num_coords_full; i++)
			coords[i] = impl.get_id_for_value(instruction->getOperand(3 + i));
	}
	spv::Id coord = impl.build_vector(builder.makeUintType(32), coords, num_coords_full);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, instruction->getType());
	if (width == RawWidth::B64)
		builder.addCapability(spv::CapabilityInt64Atomics);

	DXIL::ComponentType component_type;
	spv::Id counter_ptr_id = emit_atomic_access_chain(impl, meta, width, image_id, coord, component_type);

	if (meta.non_uniform)
		builder.addDecoration(counter_ptr_id, spv::DecorationNonUniformEXT);

	spv::Op opcode;

	switch (binop)
	{
	case DXIL::AtomicBinOp::Exchange:
		opcode = spv::OpAtomicExchange;
		break;

	case DXIL::AtomicBinOp::IAdd:
		opcode = spv::OpAtomicIAdd;
		break;

	case DXIL::AtomicBinOp::And:
		opcode = spv::OpAtomicAnd;
		break;

	case DXIL::AtomicBinOp::Or:
		opcode = spv::OpAtomicOr;
		break;

	case DXIL::AtomicBinOp::Xor:
		opcode = spv::OpAtomicXor;
		break;

	case DXIL::AtomicBinOp::IMin:
		opcode = spv::OpAtomicSMin;
		break;

	case DXIL::AtomicBinOp::IMax:
		opcode = spv::OpAtomicSMax;
		break;

	case DXIL::AtomicBinOp::UMin:
		opcode = spv::OpAtomicUMin;
		break;

	case DXIL::AtomicBinOp::UMax:
		opcode = spv::OpAtomicUMax;
		break;

	default:
		return false;
	}

	Operation *op = impl.allocate(opcode, instruction, impl.get_type_id(component_type, 1, 1));

	op->add_id(counter_ptr_id);
	op->add_id(builder.makeUintConstant(spv::ScopeDevice));
	op->add_id(builder.makeUintConstant(0));
	op->add_id(impl.fixup_store_type_atomic(component_type, 1, impl.get_id_for_value(instruction->getOperand(6))));

	impl.add(op, meta.rov);

	impl.fixup_load_type_atomic(component_type, 1, instruction);
	return true;
}